

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O3

void str_split(char *str,char *left,char *right,char c)

{
  char *pcVar1;
  undefined3 in_register_00000009;
  
  pcVar1 = strchr(str,CONCAT31(in_register_00000009,c));
  if (pcVar1 != (char *)0x0) {
    strncpy(left,str,(long)pcVar1 - (long)str);
    str = pcVar1 + 1;
    left = right;
  }
  strcpy(left,str);
  return;
}

Assistant:

void str_split(const char *str, char *left, char *right, char c) {
  char *p = strchr(str, c);
  if (p == NULL) {
    strcpy(left, str);
  } else {
    strncpy(left, str, p - str);
    strcpy(right, p + 1);
  }
}